

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField(MapFieldBase *this)

{
  TaggedPtr p;
  ReflectionPayload *pRVar1;
  
  p = (this->super_MapFieldBaseForParse).payload_._M_i;
  if ((p & 1) != 0) {
    pRVar1 = ToPayload(p);
    if ((pRVar1 != (ReflectionPayload *)0x0) && ((pRVar1->state)._M_i == STATE_MODIFIED_REPEATED)) {
      pRVar1 = payload(this);
      absl::lts_20250127::Mutex::Lock(&pRVar1->mutex);
      if ((pRVar1->state)._M_i == STATE_MODIFIED_REPEATED) {
        SyncMapWithRepeatedFieldNoLock(this);
        (pRVar1->state)._M_i = CLEAN;
      }
      absl::lts_20250127::Mutex::Unlock(&pRVar1->mutex);
    }
  }
  return;
}

Assistant:

void MapFieldBase::SyncMapWithRepeatedField() const {
  ConstAccess();
  // acquire here matches with release below to ensure that we can only see a
  // value of CLEAN after all previous changes have been synced.
  if (state() == STATE_MODIFIED_REPEATED) {
    auto& p = payload();
    {
      absl::MutexLock lock(&p.mutex);
      // Double check state, because another thread may have seen the same state
      // and done the synchronization before the current thread.
      if (p.state.load(std::memory_order_relaxed) == STATE_MODIFIED_REPEATED) {
        const_cast<MapFieldBase*>(this)->SyncMapWithRepeatedFieldNoLock();
        p.state.store(CLEAN, std::memory_order_release);
      }
    }
    ConstAccess();
  }
}